

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

void jx9HashmapExtractNodeKey(jx9_hashmap_node *pNode,jx9_value *pKey)

{
  uint uVar1;
  
  if (pNode->iType == 1) {
    if ((pKey->sBlob).nByte != 0) {
      SyBlobRelease(&pKey->sBlob);
    }
    pKey->x = (anon_union_8_3_18420de5_for_x)(pNode->xKey).iKey;
    uVar1 = 2;
  }
  else {
    SyBlobReset(&pKey->sBlob);
    SyBlobAppend(&pKey->sBlob,(pNode->xKey).sKey.pBlob,(pNode->xKey).sKey.nByte);
    uVar1 = 1;
  }
  pKey->iFlags = pKey->iFlags & 0xfffffe90U | uVar1;
  return;
}

Assistant:

JX9_PRIVATE void jx9HashmapExtractNodeKey(jx9_hashmap_node *pNode,jx9_value *pKey)
{
	/* Fill with the current key */
	if( pNode->iType == HASHMAP_INT_NODE ){
		if( SyBlobLength(&pKey->sBlob) > 0 ){
			SyBlobRelease(&pKey->sBlob);
		}
		pKey->x.iVal = pNode->xKey.iKey;
		MemObjSetType(pKey, MEMOBJ_INT);
	}else{
		SyBlobReset(&pKey->sBlob);
		SyBlobAppend(&pKey->sBlob, SyBlobData(&pNode->xKey.sKey), SyBlobLength(&pNode->xKey.sKey));
		MemObjSetType(pKey, MEMOBJ_STRING);
	}
}